

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O2

VertexProperties * __thiscall
soinn::ESOINN::getBestMatch
          (VertexProperties *__return_storage_ptr__,ESOINN *this,
          vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *inputSignal)

{
  ESOINN *this_00;
  StoredVertex *sv_1;
  long lVar1;
  _List_node_base *p_Var2;
  StoredVertexList *pSVar3;
  double dVar4;
  double local_30;
  
  pSVar3 = &(this->graph).super_type.m_vertices;
  local_30 = 1.79769313486232e+308;
  lVar1 = 0;
  this_00 = (ESOINN *)__return_storage_ptr__;
  p_Var2 = (_List_node_base *)pSVar3;
  while (p_Var2 = (((_List_base<void_*,_std::allocator<void_*>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)pSVar3) {
    dVar4 = distance(this_00,inputSignal,
                     (vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                      *)((long)p_Var2[1]._M_next + 0x20));
    if (dVar4 < local_30) {
      lVar1 = (long)p_Var2[1]._M_next;
      local_30 = dVar4;
    }
  }
  VertexProperties::VertexProperties(__return_storage_ptr__,(VertexProperties *)(lVar1 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

VertexProperties ESOINN::getBestMatch(boost::numeric::ublas::vector<double>& inputSignal)
{
    Vertex firstWinner = NULL;
    double firstWinnerDistance = std::numeric_limits<double>::max();
    VertexIterator current, end;
    boost::tie(current, end) = boost::vertices(graph);
    for(; current != end; current++)
    {
        double dist = distance(inputSignal, graph[*current].weight);
        if(dist < firstWinnerDistance)
        {
            firstWinner = *current;
            firstWinnerDistance = dist;
        }
    }
    return graph[firstWinner];
}